

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::SLUFactor<double>::solve2right4update
          (SLUFactor<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *y,
          SVectorBase<double> *b,SSVectorBase<double> *rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar4;
  int *piVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  int *piVar9;
  double *forest;
  Real RVar10;
  SSVectorBase<double> *pSVar11;
  long lVar12;
  SSVectorBase<double> *pSVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int rsize;
  int n;
  SSVectorBase<double> *local_80;
  SSVectorBase<double> *local_78;
  Real local_70;
  int *local_68;
  int *local_60;
  double *local_58;
  undefined8 uStack_50;
  CLUFactor<double> *local_48;
  int *local_40;
  int f;
  
  (*this->solveTime->_vptr_Timer[3])();
  local_60 = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  rsize = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  local_68 = (rhs->super_IdxSet).idx;
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_70 = Tolerances::epsilon(this_00);
  local_78 = rhs;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<double>::clear(x);
  local_80 = y;
  SSVectorBase<double>::clear(y);
  this->usetup = true;
  SSVectorBase<double>::clear(&this->ssvec);
  iVar1 = b->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if (0 < (long)iVar1) {
    lVar12 = 0;
    do {
      iVar2 = *(int *)((long)&b->m_elem->idx + lVar12);
      local_58 = *(double **)((long)&b->m_elem->val + lVar12);
      uStack_50 = 0;
      RVar10 = Tolerances::epsilon((this->ssvec)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      pdVar4 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar14 = 0;
      uVar15 = 0;
      if (RVar10 < ABS((double)local_58)) {
        piVar5 = (this->ssvec).super_IdxSet.idx;
        iVar3 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar3 + 1;
        piVar5[iVar3] = iVar2;
        uVar14 = SUB84(local_58,0);
        uVar15 = (undefined4)((ulong)local_58 >> 0x20);
      }
      pdVar4[iVar2] = (double)CONCAT44(uVar15,uVar14);
      lVar12 = lVar12 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar12);
  }
  pSVar13 = local_78;
  pSVar11 = local_80;
  (this->ssvec).setupStatus = true;
  if ((this->super_CLUFactor<double>).l.updateType == 0) {
    n = (this->ssvec).super_IdxSet.num;
    piVar5 = (x->super_IdxSet).idx;
    pdVar6 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pdVar7 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar9 = (local_80->super_IdxSet).idx;
    pdVar8 = (local_80->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_80->setupStatus = false;
    local_78->setupStatus = false;
    CLUFactor<double>::vSolveRight4update2sparse
              (&this->super_CLUFactor<double>,local_70,pdVar6,piVar5,pdVar7,local_60,&n,local_70,
               pdVar8,piVar9,
               (local_78->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,local_68,&rsize,(double *)0x0,(int *)0x0,(int *)0x0);
    (x->super_IdxSet).num = n;
    x->setupStatus = false;
    (pSVar11->super_IdxSet).num = rsize;
    pSVar11->setupStatus = false;
    SSVectorBase<double>::setup_and_assign<double>(&this->eta,x);
  }
  else {
    local_48 = &this->super_CLUFactor<double>;
    SSVectorBase<double>::clear(&this->forest);
    pSVar13 = local_78;
    pSVar11 = local_80;
    n = (this->ssvec).super_IdxSet.num;
    piVar5 = (x->super_IdxSet).idx;
    pdVar6 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pdVar7 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_40 = (local_80->super_IdxSet).idx;
    local_58 = (local_80->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_80->setupStatus = false;
    local_78->setupStatus = false;
    pdVar8 = (local_78->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar9 = (this->forest).super_IdxSet.idx;
    forest = (this->forest).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->forest).setupStatus = false;
    CLUFactor<double>::vSolveRight4update2sparse
              (local_48,local_70,pdVar6,piVar5,pdVar7,local_60,&n,local_70,local_58,local_40,pdVar8,
               local_68,&rsize,forest,&f,piVar9);
    (x->super_IdxSet).num = n;
    x->setupStatus = true;
    (pSVar11->super_IdxSet).num = rsize;
    pSVar11->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  pSVar13->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve2right4update(
   SSVectorBase<R>&       x,
   SSVectorBase<R>&       y,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs)
{

   solveTime->start();

   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      this->vSolveRight4update2sparse(epsilon, x.altValues(), x.altIndexMem(),
                                      ssvec.get_ptr(), sidx, n,
                                      epsilon, y.altValues(), y.altIndexMem(),
                                      rhs.altValues(), ridx, rsize,
                                      nullptr, nullptr, nullptr);
      x.setSize(n);
      //      x.forceSetup();
      x.unSetup();
      y.setSize(rsize);
      y.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      this->vSolveRight4update2sparse(epsilon, x.altValues(), x.altIndexMem(),
                                      ssvec.get_ptr(), sidx, n,
                                      epsilon, y.altValues(), y.altIndexMem(),
                                      rhs.altValues(), ridx, rsize,
                                      forest.altValues(), &f, forest.altIndexMem());
      x.setSize(n);
      x.forceSetup();
      y.setSize(rsize);
      y.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}